

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_>::CopyIntPtIndicesFrom
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *this,
          TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *copy)

{
  long lVar1;
  TPZMaterial *pTVar2;
  ostream *poVar3;
  int64_t iVar4;
  long *plVar5;
  long in_RSI;
  long in_RDI;
  TPZManVector<long,_128> *unaff_retaddr;
  int64_t n;
  int64_t i;
  TPZMaterial *material;
  TPZCompEl *in_stack_ffffffffffffffe0;
  long lVar6;
  
  lVar6 = in_RDI;
  pTVar2 = TPZCompEl::Material(in_stack_ffffffffffffffe0);
  if (pTVar2 == (TPZMaterial *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar3 = std::operator<<(poVar3,
                             "void TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>>::CopyIntPtIndicesFrom(const TPZCompElWithMem<TBASE> &) [TBASE = TPZCompElH1<pzshape::TPZShapeQuad>]"
                            );
    std::operator<<(poVar3," this->Material() == NULL\n");
  }
  else {
    iVar4 = TPZVec<long>::NElements((TPZVec<long> *)(in_RSI + 0xc0));
    TPZManVector<long,_128>::Resize(unaff_retaddr,lVar6);
    for (lVar6 = 0; lVar6 < iVar4; lVar6 = lVar6 + 1) {
      plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RSI + 0xc0),lVar6);
      lVar1 = *plVar5;
      plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xc0),lVar6);
      *plVar5 = lVar1;
    }
  }
  return;
}

Assistant:

void TPZCompElWithMem<TBASE>::CopyIntPtIndicesFrom(const TPZCompElWithMem<TBASE> & copy)
{
    
    TPZMaterial * material = TBASE::Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    int64_t i, n = copy.fIntPtIndices.NElements();
    fIntPtIndices.Resize(n);
    
    for(i = 0; i < n; i++)
    {
        fIntPtIndices[i] = copy.fIntPtIndices[i];
    }
}